

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.h
# Opt level: O1

bool InliningDecider::IsInlineeLeaf(FunctionBody *inlinee)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  undefined4 *puVar3;
  DynamicProfileInfo *this;
  
  if ((inlinee->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
    if ((inlinee->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,InlineBuiltInCallerPhase,sourceContextId,
                       ((inlinee->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (bVar2) {
      if (inlinee->profiledCallSiteCount == 0) {
LAB_005666eb:
        this = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee);
        bVar2 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this);
        return !bVar2;
      }
    }
    else {
      bVar2 = Js::FunctionBody::HasNonBuiltInCallee(inlinee);
      if (!bVar2) goto LAB_005666eb;
    }
  }
  return false;
}

Assistant:

static bool IsInlineeLeaf(Js::FunctionBody * const inlinee)
    {
        return inlinee->HasDynamicProfileInfo()
            && (!PHASE_OFF(Js::InlineBuiltInCallerPhase, inlinee) ? !inlinee->HasNonBuiltInCallee() : inlinee->GetProfiledCallSiteCount() == 0)
            && !inlinee->GetAnyDynamicProfileInfo()->HasLdFldCallSiteInfo();
    }